

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int32_t interleavedBinarySearch(rle16_t *array,int32_t lenarray,uint16_t ikey)

{
  int iVar1;
  int iStack_28;
  uint16_t middleValue;
  int32_t middleIndex;
  int32_t high;
  int32_t low;
  uint16_t ikey_local;
  int32_t lenarray_local;
  rle16_t *array_local;
  
  middleIndex = 0;
  iStack_28 = lenarray + -1;
  while( true ) {
    while( true ) {
      if (iStack_28 < middleIndex) {
        return -(middleIndex + 1);
      }
      iVar1 = middleIndex + iStack_28 >> 1;
      if (ikey <= array[iVar1].value) break;
      middleIndex = iVar1 + 1;
    }
    if (array[iVar1].value <= ikey) break;
    iStack_28 = iVar1 + -1;
  }
  return iVar1;
}

Assistant:

inline int32_t interleavedBinarySearch(const rle16_t *array, int32_t lenarray,
                                       uint16_t ikey) {
    int32_t low = 0;
    int32_t high = lenarray - 1;
    while (low <= high) {
        int32_t middleIndex = (low + high) >> 1;
        uint16_t middleValue = array[middleIndex].value;
        if (middleValue < ikey) {
            low = middleIndex + 1;
        } else if (middleValue > ikey) {
            high = middleIndex - 1;
        } else {
            return middleIndex;
        }
    }
    return -(low + 1);
}